

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

void SzArEx_Init(CSzArEx *p)

{
  (p->db).CoderUnpackSizes = (UInt64 *)0x0;
  (p->db).CodersData = (Byte *)0x0;
  (p->db).FoToCoderUnpackSizes = (UInt32 *)0x0;
  (p->db).FoToMainUnpackSizeIndex = (Byte *)0x0;
  (p->db).FoCodersOffsets = (size_t *)0x0;
  (p->db).FoStartPackStreamIndex = (UInt32 *)0x0;
  (p->db).FolderCRCs.Defs = (Byte *)0x0;
  (p->db).FolderCRCs.Vals = (UInt32 *)0x0;
  (p->db).NumPackStreams = 0;
  (p->db).NumFolders = 0;
  (p->db).PackPositions = (UInt64 *)0x0;
  p->NumFiles = 0;
  p->dataPos = 0;
  p->UnpackPositions = (UInt64 *)0x0;
  p->IsDirs = (Byte *)0x0;
  (p->CRCs).Defs = (Byte *)0x0;
  (p->CRCs).Vals = (UInt32 *)0x0;
  (p->Attribs).Defs = (Byte *)0x0;
  (p->Attribs).Vals = (UInt32 *)0x0;
  (p->MTime).Defs = (Byte *)0x0;
  (p->MTime).Vals = (CNtfsFileTime *)0x0;
  (p->CTime).Defs = (Byte *)0x0;
  (p->CTime).Vals = (CNtfsFileTime *)0x0;
  p->FolderToFile = (UInt32 *)0x0;
  p->FileToFolder = (UInt32 *)0x0;
  p->FileNameOffsets = (size_t *)0x0;
  p->FileNames = (Byte *)0x0;
  return;
}

Assistant:

void SzArEx_Init(CSzArEx *p)
{
  SzAr_Init(&p->db);
  
  p->NumFiles = 0;
  p->dataPos = 0;
  
  p->UnpackPositions = NULL;
  p->IsDirs = NULL;
  
  p->FolderToFile = NULL;
  p->FileToFolder = NULL;
  
  p->FileNameOffsets = NULL;
  p->FileNames = NULL;
  
  SzBitUi32s_Init(&p->CRCs);
  SzBitUi32s_Init(&p->Attribs);
  // SzBitUi32s_Init(&p->Parents);
  SzBitUi64s_Init(&p->MTime);
  SzBitUi64s_Init(&p->CTime);
}